

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  bool bVar1;
  undefined7 in_register_00000011;
  undefined4 in_XMM1_Db;
  vec3 vVar2;
  undefined8 local_98;
  ulong local_88;
  undefined8 local_78;
  undefined8 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000011,alwaysPass) == 0) {
    vVar2 = getNormal(this);
    local_68 = vVar2._0_8_;
    bVar1 = (this->active).value;
    local_88 = (ulong)((uint)(bVar1 & 1) * (int)(this->objectTransform).value.value[3].field_2);
    if (bVar1 == false) {
      local_98 = SUB648(ZEXT464(0x7f800000),0);
    }
    else {
      local_98 = SUB168((this->objectTransform).value.value[3],0);
    }
    local_78 = CONCAT44(in_XMM1_Db,vVar2.field_2);
  }
  else {
    local_68 = SUB648(ZEXT464(0xbf800000),0);
    local_88 = 0;
    local_98 = SUB648(ZEXT464(0x7f800000),0);
    local_78 = 0;
  }
  std::operator+(&local_38,"u_slicePlaneNormal_",&this->postfix);
  (*p->_vptr_ShaderProgram[9])(local_68,local_78,p,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_58,"u_slicePlaneCenter_",&this->postfix);
  (*p->_vptr_ShaderProgram[9])(local_98,local_88,p,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    normal = getNormal();
    center = getCenter();
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}